

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

int __thiscall Cleaner::CleanTarget(Cleaner *this,char *target)

{
  State *this_00;
  StringPiece local_30;
  Node *local_20;
  Node *node;
  char *target_local;
  Cleaner *this_local;
  
  node = (Node *)target;
  target_local = (char *)this;
  if (target != (char *)0x0) {
    Reset(this);
    this_00 = this->state_;
    StringPiece::StringPiece(&local_30,(char *)node);
    local_20 = State::LookupNode(this_00,local_30);
    if (local_20 == (Node *)0x0) {
      Error("unknown target \'%s\'",node);
      this->status_ = 1;
    }
    else {
      CleanTarget(this,local_20);
    }
    return this->status_;
  }
  __assert_fail("target",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean.cc"
                ,0xa0,"int Cleaner::CleanTarget(const char *)");
}

Assistant:

int Cleaner::CleanTarget(const char* target) {
  assert(target);

  Reset();
  Node* node = state_->LookupNode(target);
  if (node) {
    CleanTarget(node);
  } else {
    Error("unknown target '%s'", target);
    status_ = 1;
  }
  return status_;
}